

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SPIRVariable * __thiscall
diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRVariable>::
allocate<unsigned_int&,spv::StorageClass&,unsigned_int&>
          (ObjectPool<diligent_spirv_cross::SPIRVariable> *this,uint *p,StorageClass *p_1,uint *p_2)

{
  uint uVar1;
  StorageClass storage_;
  SPIRVariable *this_00;
  bool bVar2;
  size_t sVar3;
  SPIRVariable **ppSVar4;
  VariableID local_64;
  ID local_60;
  TypeID local_5c;
  SPIRVariable *local_58;
  SPIRVariable *ptr;
  uint local_44;
  SPIRVariable *pSStack_40;
  uint i;
  SPIRVariable *ptr_1;
  uint *puStack_30;
  uint num_objects;
  uint *p_local_2;
  StorageClass *p_local_1;
  uint *p_local;
  ObjectPool<diligent_spirv_cross::SPIRVariable> *this_local;
  
  puStack_30 = p_2;
  p_local_2 = p_1;
  p_local_1 = p;
  p_local = (uint *)this;
  bVar2 = VectorView<diligent_spirv_cross::SPIRVariable_*>::empty
                    (&(this->vacants).super_VectorView<diligent_spirv_cross::SPIRVariable_*>);
  if (bVar2) {
    uVar1 = this->start_object_count;
    sVar3 = VectorView<std::unique_ptr<diligent_spirv_cross::SPIRVariable,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRVariable>::MallocDeleter>_>
            ::size(&(this->memory).
                    super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRVariable,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRVariable>::MallocDeleter>_>
                  );
    ptr_1._4_4_ = uVar1 << ((byte)sVar3 & 0x1f);
    pSStack_40 = (SPIRVariable *)malloc((ulong)ptr_1._4_4_ * 0xb0);
    if (pSStack_40 == (SPIRVariable *)0x0) {
      return (SPIRVariable *)0x0;
    }
    SmallVector<diligent_spirv_cross::SPIRVariable_*,_0UL>::reserve
              (&this->vacants,(ulong)ptr_1._4_4_);
    for (local_44 = 0; local_44 < ptr_1._4_4_; local_44 = local_44 + 1) {
      ptr = pSStack_40 + local_44;
      SmallVector<diligent_spirv_cross::SPIRVariable_*,_0UL>::push_back(&this->vacants,&ptr);
    }
    SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRVariable,diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRVariable>::MallocDeleter>,8ul>
    ::emplace_back<diligent_spirv_cross::SPIRVariable*&>
              ((SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRVariable,diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRVariable>::MallocDeleter>,8ul>
                *)&this->memory,&stack0xffffffffffffffc0);
  }
  ppSVar4 = VectorView<diligent_spirv_cross::SPIRVariable_*>::back
                      (&(this->vacants).super_VectorView<diligent_spirv_cross::SPIRVariable_*>);
  local_58 = *ppSVar4;
  SmallVector<diligent_spirv_cross::SPIRVariable_*,_0UL>::pop_back(&this->vacants);
  this_00 = local_58;
  TypedID<(diligent_spirv_cross::Types)1>::TypedID(&local_5c,*p_local_1);
  storage_ = *p_local_2;
  TypedID<(diligent_spirv_cross::Types)0>::TypedID(&local_60,*puStack_30);
  TypedID<(diligent_spirv_cross::Types)2>::TypedID(&local_64,0);
  SPIRVariable::SPIRVariable(this_00,local_5c,storage_,local_60,local_64);
  return local_58;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}